

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xsDefs.cpp
# Opt level: O3

void __thiscall xs::Error::Error(Error *this,char *message,char *expr,char *file,int line)

{
  size_t sVar1;
  ostream *poVar2;
  char *__s;
  undefined1 auStack_1d8 [11];
  char local_1cd;
  int local_1cc;
  long *local_1c8 [2];
  long local_1b8 [2];
  long local_1a8 [14];
  ios_base local_138 [264];
  
  local_1cc = line;
  std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1a8);
  __s = "Runtime check failed";
  if (message != (char *)0x0) {
    __s = message;
  }
  sVar1 = strlen(__s);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,__s,sVar1);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,": ",2);
  if (expr != (char *)0x0) {
    local_1cd = '\'';
    poVar2 = std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,&local_1cd,1);
    sVar1 = strlen(expr);
    std::__ostream_insert<char,std::char_traits<char>>(poVar2,expr,sVar1);
    local_1cd = '\'';
    std::__ostream_insert<char,std::char_traits<char>>(poVar2,&local_1cd,1);
  }
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8," at ",4);
  if (file == (char *)0x0) {
    std::ios::clear((int)auStack_1d8 + (int)*(undefined8 *)(local_1a8[0] + -0x18) + 0x30);
  }
  else {
    sVar1 = strlen(file);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,file,sVar1);
  }
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,":",1);
  std::ostream::operator<<((ostream *)local_1a8,local_1cc);
  std::__cxx11::stringbuf::str();
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_1a8);
  std::ios_base::~ios_base(local_138);
  std::runtime_error::runtime_error(&this->super_runtime_error,(string *)local_1c8);
  if (local_1c8[0] != local_1b8) {
    operator_delete(local_1c8[0],local_1b8[0] + 1);
  }
  *(undefined ***)this = &PTR__runtime_error_0012a4f0;
  return;
}

Assistant:

Error::Error (const char* message, const char* expr, const char* file, int line)
	: std::runtime_error(formatError(message, expr, file, line))
{
}